

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O3

image * __thiscall basisu::image::flip_y(image *this)

{
  uint uVar1;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar2;
  color_rgba *pcVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  
  uVar6 = this->m_height;
  if (1 < uVar6) {
    uVar7 = this->m_width;
    uVar4 = 0;
    iVar5 = -1;
    do {
      bVar9 = uVar7 != 0;
      uVar7 = 0;
      if (bVar9) {
        uVar6 = 0;
        do {
          uVar7 = this->m_height;
          if (uVar7 <= uVar4) {
LAB_0021bc2e:
            __assert_fail("x < m_width && y < m_height",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                          ,0xb01,"color_rgba &basisu::image::operator()(uint32_t, uint32_t)");
          }
          uVar1 = (this->m_pixels).m_size;
          uVar8 = uVar4 * this->m_pitch + uVar6;
          if (uVar1 <= uVar8) {
LAB_0021bc4d:
            __assert_fail("i < m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x178,
                          "T &basisu::vector<basisu::color_rgba>::operator[](size_t) [T = basisu::color_rgba]"
                         );
          }
          if (!CARRY4(uVar7,~uVar4)) goto LAB_0021bc2e;
          uVar7 = this->m_pitch * (uVar7 + iVar5) + uVar6;
          if (uVar1 <= uVar7) goto LAB_0021bc4d;
          pcVar3 = (this->m_pixels).m_p;
          aVar2 = pcVar3[uVar8].field_0;
          pcVar3[uVar8].field_0 = pcVar3[uVar7].field_0;
          pcVar3[uVar7].field_0 = aVar2;
          uVar6 = uVar6 + 1;
          uVar7 = this->m_width;
        } while (uVar6 < uVar7);
        uVar6 = this->m_height;
      }
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + -1;
    } while (uVar4 < uVar6 >> 1);
  }
  return this;
}

Assistant:

image &flip_y()
		{
			for (uint32_t y = 0; y < m_height / 2; ++y)
				for (uint32_t x = 0; x < m_width; ++x)
					std::swap((*this)(x, y), (*this)(x, m_height - 1 - y));
			return *this;
		}